

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O1

void cf_h1_proxy_close(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_cfilter *pCVar1;
  
  if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  if ((h1_tunnel_state_conflict *)cf->ctx != (h1_tunnel_state_conflict *)0x0) {
    h1_tunnel_go_state(cf,(h1_tunnel_state_conflict *)cf->ctx,H1_TUNNEL_INIT,data);
  }
  pCVar1 = cf->next;
  if (pCVar1 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar1->cft->do_close)(pCVar1,data);
    return;
  }
  return;
}

Assistant:

static void cf_h1_proxy_close(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  CURL_TRC_CF(data, cf, "close");
  cf->connected = FALSE;
  if(cf->ctx) {
    h1_tunnel_go_state(cf, cf->ctx, H1_TUNNEL_INIT, data);
  }
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
}